

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
::SmallVector(SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
              *this,SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
                    *RHS)

{
  bool bVar1;
  SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
  *RHS_local;
  SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
  *this_local;
  
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
  ::SmallVectorImpl(&this->
                     super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
                    ,10);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
    ::operator=(&this->
                 super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
                ,&RHS->
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<45U,_Fixpp::Type::Int>_>,_Fixpp::TagT<371U,_Fixpp::Type::Int>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<373U,_Fixpp::Type::Int>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
               );
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }